

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.hpp
# Opt level: O1

void __thiscall
jsonip::detail::struct_helper<C>::member_writer<jsonip::writer<true>>::operator()
          (member_writer<jsonip::writer<true>> *this,integral_c<int,_2> *param_1)

{
  byte bVar1;
  writer<true> *this_00;
  char *pcVar2;
  
  writer<true>::new_member(*(writer<true> **)this,"c");
  this_00 = *(writer<true> **)this;
  bVar1 = *(byte *)(*(long *)(this + 8) + 0x20);
  writer<true>::pre(this_00);
  pcVar2 = "false";
  if ((ulong)bVar1 != 0) {
    pcVar2 = "true";
  }
  std::__ostream_insert<char,std::char_traits<char>>(this_00->os,pcVar2,(ulong)bVar1 ^ 5);
  this_00->comma = true;
  return;
}

Assistant:

void operator()(const N&)
            {
                typedef boost::fusion::extension::struct_member_name<
                    T, N::value> name_t;
                typedef typename boost::fusion::result_of::value_at<T, N>::type
                    current_t;
                typedef typename calculate_helper<current_t>::type helper_t;

                w.new_member(name_t::call());
                helper_t::write(w, boost::fusion::at<N>(t));
            }